

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O3

void storeRGBA32FFromRGBA32F_sse4
               (uchar *dest,QRgbaFloat32 *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar11;
  float fVar12;
  undefined1 auVar9 [16];
  float fVar13;
  undefined1 auVar10 [16];
  
  if (0 < count) {
    lVar3 = 0;
    do {
      pfVar1 = (float *)((long)&src->r + lVar3);
      fVar4 = *pfVar1;
      fVar5 = pfVar1[1];
      fVar6 = pfVar1[2];
      fVar7 = pfVar1[3];
      if ((fVar7 != 1.0) || (NAN(fVar7))) {
        auVar9 = ZEXT816(0);
        if ((fVar7 != 0.0) || (NAN(fVar7))) {
          auVar2._4_4_ = fVar7;
          auVar2._0_4_ = fVar7;
          auVar2._8_4_ = fVar7;
          auVar2._12_4_ = fVar7;
          auVar9 = rcpps(auVar9,auVar2);
          fVar8 = auVar9._0_4_;
          fVar11 = auVar9._4_4_;
          fVar12 = auVar9._8_4_;
          fVar13 = auVar9._12_4_;
          auVar10._0_4_ = (fVar8 + fVar8) - fVar7 * fVar8 * fVar8;
          auVar10._4_4_ = (fVar11 + fVar11) - fVar7 * fVar11 * fVar11;
          auVar10._8_4_ = (fVar12 + fVar12) - fVar7 * fVar12 * fVar12;
          auVar10._12_4_ = (fVar13 + fVar13) - fVar7 * fVar13 * fVar13;
          auVar9 = insertps(auVar10,0x3f800000,0x30);
          fVar4 = fVar4 * auVar9._0_4_;
          fVar5 = fVar5 * auVar9._4_4_;
          fVar6 = fVar6 * auVar9._8_4_;
          fVar7 = fVar7 * auVar9._12_4_;
          goto LAB_005ad1b4;
        }
      }
      else {
LAB_005ad1b4:
        auVar9._4_4_ = fVar5;
        auVar9._0_4_ = fVar4;
        auVar9._8_4_ = fVar6;
        auVar9._12_4_ = fVar7;
      }
      *(undefined1 (*) [16])(dest + lVar3 + (long)index * 0x10) = auVar9;
      lVar3 = lVar3 + 0x10;
    } while ((ulong)(uint)count << 4 != lVar3);
  }
  return;
}

Assistant:

void QT_FASTCALL storeRGBA32FFromRGBA32F_sse4(uchar *dest, const QRgbaFloat32 *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    QRgbaFloat32 *d = reinterpret_cast<QRgbaFloat32 *>(dest) + index;
    const __m128 zero = _mm_set1_ps(0.0f);
    for (int i = 0; i < count; ++i) {
        __m128 vsf = _mm_load_ps(reinterpret_cast<const float *>(src + i));
        const __m128 vsa = _mm_shuffle_ps(vsf, vsf, _MM_SHUFFLE(3, 3, 3, 3));
        const float a = _mm_cvtss_f32(vsa);
        if (a == 1.0f)
        { }
        else if (a == 0.0f)
            vsf = zero;
        else {
            __m128 vsr = _mm_rcp_ps(vsa);
            vsr = _mm_sub_ps(_mm_add_ps(vsr, vsr), _mm_mul_ps(vsr, _mm_mul_ps(vsr, vsa)));
            vsr = _mm_insert_ps(vsr, _mm_set_ss(1.0f), 0x30);
            vsf = _mm_mul_ps(vsf, vsr);
        }
        _mm_store_ps(reinterpret_cast<float *>(d + i), vsf);
    }
}